

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_ast_t * mpc_ast_build(int n,char *tag,...)

{
  mpc_ast_t *r;
  long lVar1;
  char *in_RCX;
  char *in_RDX;
  int in_EDI;
  va_list va;
  int i;
  mpc_ast_t *a;
  mpc_ast_t *a_00;
  uint local_38;
  mpc_ast_t *local_30;
  int local_1c;
  
  r = mpc_ast_new(in_RCX,in_RDX);
  local_30 = (mpc_ast_t *)&stack0x00000008;
  local_38 = 0x10;
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    if (local_38 < 0x29) {
      lVar1 = (long)(int)local_38;
      local_38 = local_38 + 8;
      a_00 = (mpc_ast_t *)(&stack0xffffffffffffff18 + lVar1);
    }
    else {
      a_00 = local_30;
      local_30 = (mpc_ast_t *)&local_30->contents;
    }
    mpc_ast_add_child(r,a_00);
  }
  return r;
}

Assistant:

mpc_ast_t *mpc_ast_build(int n, const char *tag, ...) {

  mpc_ast_t *a = mpc_ast_new(tag, "");

  int i;
  va_list va;
  va_start(va, tag);

  for (i = 0; i < n; i++) {
    mpc_ast_add_child(a, va_arg(va, mpc_ast_t*));
  }

  va_end(va);

  return a;

}